

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONHandler.cc
# Opt level: O1

void __thiscall JSONHandler::JSONHandler(JSONHandler *this)

{
  _Base_ptr p_Var1;
  _Head_base<0UL,_JSONHandler::Members_*,_false> __s;
  
  __s._M_head_impl = (Members *)operator_new(0x180);
  p_Var1 = (_Base_ptr)((long)&(__s._M_head_impl)->h + 0x128);
  memset(__s._M_head_impl,0,0x180);
  *(_Base_ptr *)((long)&(__s._M_head_impl)->h + 0x138) = p_Var1;
  *(_Base_ptr *)((long)&(__s._M_head_impl)->h + 0x140) = p_Var1;
  *(size_t *)((long)&(__s._M_head_impl)->h + 0x148) = 0;
  (((shared_ptr<JSONHandler> *)((long)&(__s._M_head_impl)->h + 0x150))->
  super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(__s._M_head_impl)->h + 0x158))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((shared_ptr<JSONHandler> *)((long)&(__s._M_head_impl)->h + 0x160))->
  super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(__s._M_head_impl)->h + 0x168))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((shared_ptr<JSONHandler> *)((long)&(__s._M_head_impl)->h + 0x170))->
  super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(__s._M_head_impl)->h + 0x178))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m)._M_t.
  super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
  super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
  super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl = __s._M_head_impl;
  return;
}

Assistant:

JSONHandler::JSONHandler() :
    m(new Members())
{
}